

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall xla::GraphCycles::CheckInvariants(GraphCycles *this)

{
  int iVar1;
  Rep *pRVar2;
  pointer pNVar3;
  int *piVar4;
  int *piVar5;
  ostream *poVar6;
  pointer pNVar7;
  pointer pNVar8;
  ulong uVar9;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar10;
  NodeSet ranks;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pRVar2 = this->rep_;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pNVar8 = (pRVar2->nodes_).
           super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pRVar2->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar8) {
    uVar9 = 0;
    do {
      if (pNVar8[uVar9].visited == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Did not clear visited marker on node ",0x25);
        std::ostream::operator<<((ostream *)&std::cerr,uVar9);
LAB_00197ca6:
        exit(1);
      }
      pNVar7 = pNVar8 + uVar9;
      local_70 = &local_68;
      pVar10 = std::
               _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                         ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)&local_68,pNVar7,&local_70);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Duplicate occurrence of rank ",0x1d);
        std::ostream::operator<<((ostream *)&std::cerr,pNVar7->rank);
        goto LAB_00197ca6;
      }
      pNVar8 = (pRVar2->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar3 = (pRVar2->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = *(int **)&pNVar3[uVar9].out.value_sequence_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      piVar4 = *(pointer *)
                ((long)&pNVar3[uVar9].out.value_sequence_.
                        super__Vector_base<int,_std::allocator<int>_> + 8);
      if (piVar5 != piVar4) {
        do {
          iVar1 = *piVar5;
          if (pNVar8[iVar1].rank <= pNVar7->rank) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Edge ",5);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"->",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," has bad rank assignment ",0x19);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pNVar7->rank);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"->",2);
            std::ostream::operator<<(poVar6,pNVar8[iVar1].rank);
            goto LAB_00197ca6;
          }
          piVar5 = piVar5 + 1;
        } while (piVar5 != piVar4);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(pRVar2->nodes_).
                                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3));
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return true;
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (size_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = &r->nodes_[x];
    if (nx->visited) {
      // LOG(FATAL) << "Did not clear visited marker on node " << x;
      std::cerr << "Did not clear visited marker on node " << x;
      std::exit(EXIT_FAILURE);  
    }
    if (!ranks.insert(nx->rank).second) {
      // LOG(FATAL) << "Duplicate occurrence of rank " << nx->rank;
      std::cerr  << "Duplicate occurrence of rank " << nx->rank;
      std::exit(EXIT_FAILURE);
    }
    NodeIO* nx_io = &r->node_io_[x];
    for (int32_t y : nx_io->out.GetSequence()) {
      Node* ny = &r->nodes_[y];
      if (nx->rank >= ny->rank) {
        /* LOG(FATAL) << "Edge " << x << "->" << y << " has bad rank assignment "
                   << nx->rank << "->" << ny->rank; */

        std::cerr << "Edge " << x << "->" << y << " has bad rank assignment "
                  << nx->rank << "->" << ny->rank;
        std::exit(EXIT_FAILURE);
      }
    }
  }
  return true;
}